

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cKHRDebugTests.cpp
# Opt level: O3

void gl4cts::KHRDebug::fillGroupStack(Functions *gl)

{
  deUint32 err;
  
  (*gl->pushDebugGroup)(0x824a,1,4,"Foo");
  err = (*gl->getError)();
  while (err != 0x503) {
    glu::checkError(err,"PopDebugGroup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cKHRDebugTests.cpp"
                    ,0x89);
    (*gl->pushDebugGroup)(0x824a,1,4,"Foo");
    err = (*gl->getError)();
  }
  return;
}

Assistant:

void fillGroupStack(const Functions* gl)
{
	static const GLchar  message[] = "Foo";
	static const GLsizei length	= (GLsizei)(sizeof(message) / sizeof(message[0]));

	while (1)
	{
		gl->pushDebugGroup(GL_DEBUG_SOURCE_APPLICATION /* source */, 1 /* id */, length /* length */,
						   message /* message */);

		const GLenum err = gl->getError();

		if (GL_STACK_OVERFLOW == err)
		{
			break;
		}

		GLU_EXPECT_NO_ERROR(err, "PopDebugGroup");
	}
}